

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

void __thiscall
LiteScript::Callback::Callback
          (Callback *this,Memory *mem,
          _func_Variable_State_ptr_vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_ptr
          *cptr)

{
  pointer __position;
  allocator<LiteScript::Namer> allocator;
  
  this->call_ptr = cptr;
  this->memory = mem;
  (this->This).is_null = true;
  (this->This).isNull = &(this->This).is_null;
  (this->nsp).is_null = true;
  (this->nsp).isNull = &(this->nsp).is_null;
  this->I = &this->intrl_idx;
  this->L = &this->line_num;
  this->CallbackIndex = &this->callIndex;
  __position = List.
               super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  this->callIndex =
       (uint)((ulong)((long)List.
                            super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)List.
                           super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (__position ==
      List.
      super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&),std::allocator<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>>
    ::
    _M_realloc_insert<LiteScript::Variable(*const&)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>
              ((vector<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&),std::allocator<LiteScript::Variable(*)(LiteScript::State&,std::vector<LiteScript::Variable,std::allocator<LiteScript::Variable>>&)>>
                *)&List,(iterator)__position,&this->call_ptr);
  }
  else {
    *__position = cptr;
    List.
    super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         List.
         super__Vector_base<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&),_std::allocator<LiteScript::Variable_(*)(LiteScript::State_&,_std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_&)>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
  }
  return;
}

Assistant:

LiteScript::Callback::Callback(Memory& mem, Variable (* cptr)(State &, std::vector<Variable>&)) :
    memory(mem), call_ptr(cptr), I(intrl_idx), L(line_num), CallbackIndex(callIndex)
{
    this->callIndex = Callback::List.size();
    Callback::List.push_back(this->call_ptr);
}